

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineGLImplTraits>::ClearDepthStencil
          (DeviceContextBase<Diligent::EngineGLImplTraits> *this,ITextureView *pView)

{
  Uint32 *pUVar1;
  COMMAND_QUEUE_TYPE CVar2;
  int iVar3;
  undefined4 extraout_var;
  COMMAND_QUEUE_TYPE in_DL;
  COMMAND_QUEUE_TYPE extraout_DL;
  COMMAND_QUEUE_TYPE extraout_DL_00;
  COMMAND_QUEUE_TYPE extraout_DL_01;
  COMMAND_QUEUE_TYPE extraout_DL_02;
  char *in_R8;
  char (*in_R9) [8];
  string msg;
  char (*in_stack_ffffffffffffff98) [97];
  string local_60;
  String local_40;
  char (*Args_2) [186];
  
  if (pView == (ITextureView *)0x0) {
    FormatString<char[45]>(&local_60,(char (*) [45])"Depth-stencil view to clear must not be null");
    DebugAssertionFailed
              (local_60._M_dataplus._M_p,"ClearDepthStencil",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x631);
    in_DL = extraout_DL;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      in_DL = extraout_DL_00;
    }
  }
  if ((this->m_Desc).QueueType == COMMAND_QUEUE_TYPE_UNKNOWN) {
    if ((this->m_Desc).IsDeferred == false) {
      FormatString<char[79]>
                (&local_60,
                 (char (*) [79])
                 "Queue type may never be unknown for immediate contexts. This looks like a bug.");
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"ClearDepthStencil",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x633);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    FormatString<char[97]>
              (&local_60,
               (char (*) [97])
               "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    DebugAssertionFailed
              (local_60._M_dataplus._M_p,"ClearDepthStencil",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x633);
    in_DL = extraout_DL_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      in_DL = extraout_DL_02;
    }
  }
  CVar2 = (this->m_Desc).QueueType;
  if ((~CVar2 & 7) != 0) {
    GetCommandQueueTypeString_abi_cxx11_(&local_40,(Diligent *)(ulong)CVar2,in_DL);
    in_R8 = " queue.";
    FormatString<char[18],char[22],std::__cxx11::string,char[8]>
              (&local_60,(Diligent *)"ClearDepthStencil",(char (*) [18])0x917e3a,
               (char (*) [22])&local_40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",in_R9)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    DebugAssertionFailed
              (local_60._M_dataplus._M_p,"ClearDepthStencil",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x633);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  iVar3 = (*(pView->super_IDeviceObject).super_IObject._vptr_IObject[4])(pView);
  Args_2 = (char (*) [186])CONCAT44(extraout_var,iVar3);
  if ((*Args_2)[8] != TEXTURE_VIEW_DEPTH_STENCIL) {
    local_40._M_dataplus._M_p = GetTexViewTypeLiteralName((*Args_2)[8]);
    in_R8 = (char *)Args_2;
    FormatString<char[11],char_const*,char[24],char_const*,char[97]>
              (&local_60,(Diligent *)"The type (",(char (*) [11])&local_40,
               (char **)") of the texture view \'",(char (*) [24])Args_2,
               (char **)
               "\' is invalid: ClearDepthStencil command expects depth-stencil view (TEXTURE_VIEW_DEPTH_STENCIL)."
               ,in_stack_ffffffffffffff98);
    DebugAssertionFailed
              (local_60._M_dataplus._M_p,"ClearDepthStencil",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x63a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->m_pBoundDepthStencil).m_pObject != (TextureViewGLImpl *)pView) {
    if ((this->m_pActiveRenderPass).m_pObject != (RenderPassGLImpl *)0x0) {
      FormatString<char[21],char_const*,char[158]>
                (&local_60,(Diligent *)"Depth-stencil view \'",(char (*) [21])Args_2,
                 (char **)
                 "\' is not bound as framebuffer attachment. ClearDepthStencil command inside a render pass requires depth-stencil view to be bound as a framebuffer attachment."
                 ,(char (*) [158])in_R8);
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"ClearDepthStencil",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x641);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    if ((((this->m_pDevice).m_pObject)->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).
        m_DeviceInfo.Type - RENDER_DEVICE_TYPE_GL < 2) {
      FormatString<char[21],char_const*,char[141]>
                (&local_60,(Diligent *)"Depth-stencil view \'",(char (*) [21])Args_2,
                 (char **)
                 "\' is not bound to the device context. ClearDepthStencil command requires depth-stencil view be bound to the device context in OpenGL backend"
                 ,(char (*) [141])in_R8);
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(2,local_60._M_dataplus._M_p,0,0,0);
      }
    }
    else {
      FormatString<char[21],char_const*,char[186]>
                (&local_60,(Diligent *)"Depth-stencil view \'",(char (*) [21])Args_2,
                 (char **)
                 "\' is not bound to the device context. ClearDepthStencil command is more efficient when depth-stencil view is bound to the context. In OpenGL, Metal and WebGPU backends this is required."
                 ,(char (*) [186])in_R8);
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(1,local_60._M_dataplus._M_p,0,0,0);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  pUVar1 = &(this->m_Stats).CommandCounters.ClearDepthStencil;
  *pUVar1 = *pUVar1 + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::ClearDepthStencil(ITextureView* pView)
{
    DEV_CHECK_ERR(pView != nullptr, "Depth-stencil view to clear must not be null");

    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_GRAPHICS, "ClearDepthStencil");

#ifdef DILIGENT_DEVELOPMENT
    {
        const TextureViewDesc& ViewDesc = pView->GetDesc();
        DEV_CHECK_ERR(ViewDesc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL,
                      "The type (", GetTexViewTypeLiteralName(ViewDesc.ViewType), ") of the texture view '", ViewDesc.Name,
                      "' is invalid: ClearDepthStencil command expects depth-stencil view (TEXTURE_VIEW_DEPTH_STENCIL).");

        if (pView != m_pBoundDepthStencil)
        {
            DEV_CHECK_ERR(m_pActiveRenderPass == nullptr,
                          "Depth-stencil view '", ViewDesc.Name,
                          "' is not bound as framebuffer attachment. ClearDepthStencil command inside a render pass "
                          "requires depth-stencil view to be bound as a framebuffer attachment.");

            if (m_pDevice->GetDeviceInfo().IsGLDevice())
            {
                LOG_ERROR_MESSAGE("Depth-stencil view '", ViewDesc.Name,
                                  "' is not bound to the device context. ClearDepthStencil command requires "
                                  "depth-stencil view be bound to the device context in OpenGL backend");
            }
            else
            {
                LOG_DVP_WARNING_MESSAGE("Depth-stencil view '", ViewDesc.Name,
                                        "' is not bound to the device context. "
                                        "ClearDepthStencil command is more efficient when depth-stencil "
                                        "view is bound to the context. In OpenGL, Metal and WebGPU backends this is required.");
            }
        }
    }
#endif

    ++m_Stats.CommandCounters.ClearDepthStencil;
}